

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O2

CTcSrcFile *
CTcSrcFile::open_source
          (char *filename,CResLoader *res_loader,char *default_charset,int *charset_error,
          int *default_charset_error)

{
  char cVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  long __off;
  size_t sVar4;
  CTcSrcFile *pCVar5;
  CCharmapToUni *pCVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  char **local_160;
  char buf [275];
  
  *charset_error = 0;
  *default_charset_error = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
LAB_00209ccb:
    pCVar5 = (CTcSrcFile *)0x0;
  }
  else {
    __off = ftell(__stream);
    sVar4 = fread(buf,1,0x113,__stream);
    if ((((2 < sVar4) && (buf[0] == -0x11)) && (buf[1] == -0x45)) && (buf[2] == -0x41)) {
      uVar8 = 3;
      if ((sVar4 - 0xd < 0xfffffffffffffff6) && (iVar2 = bcmp(buf + 3,"#charset ",9), iVar2 == 0)) {
        for (lVar9 = 0; sVar4 - 0xc != lVar9; lVar9 = lVar9 + 1) {
          if ((buf[lVar9 + 0xc] != ' ') && (buf[lVar9 + 0xc] != '\t')) {
            if ((sVar4 - lVar9) - 0xc < 7) {
              if (sVar4 - 0x12 != lVar9) break;
            }
            else {
              iVar2 = memicmp(buf + lVar9 + 0xc,"\"utf-8\"",7);
              if (iVar2 == 0) {
                uVar8 = (int)lVar9 + 0x13;
                break;
              }
            }
            iVar2 = memicmp(buf + lVar9 + 0xc,"\"utf8\"",6);
            if (iVar2 == 0) {
              uVar8 = (int)lVar9 + 0x12;
            }
            break;
          }
        }
      }
      fseek(__stream,(ulong)uVar8 + __off,0);
      pCVar5 = (CTcSrcFile *)operator_new(0x430);
      pCVar6 = (CCharmapToUni *)operator_new(0x10);
      (pCVar6->super_CCharmap)._vptr_CCharmap = (_func_int **)0x0;
      *(undefined8 *)&(pCVar6->super_CCharmap).ref_cnt_ = 0;
      (pCVar6->super_CCharmap).ref_cnt_ = 1;
      (pCVar6->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_00303f38;
      CTcSrcFile(pCVar5,(osfildef *)__stream,pCVar6);
      return pCVar5;
    }
    if (1 < sVar4) {
      if (buf[1] == -2 && buf[0] == -1) {
        pCVar5 = (CTcSrcFile *)operator_new(0x430);
        pCVar6 = (CCharmapToUni *)operator_new(0x210);
        memset(pCVar6,0,0x210);
        (pCVar6->super_CCharmap).ref_cnt_ = 1;
        (pCVar6->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_00303fa0;
        CTcSrcFile(pCVar5,(osfildef *)__stream,pCVar6);
      }
      else {
        pCVar5 = (CTcSrcFile *)0x0;
      }
      if ((buf[0] == -2) && (buf[1] == -1)) {
        pCVar5 = (CTcSrcFile *)operator_new(0x430);
        pCVar6 = (CCharmapToUni *)operator_new(0x210);
        memset(pCVar6,0,0x210);
        (pCVar6->super_CCharmap).ref_cnt_ = 1;
        (pCVar6->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_00304070;
        CTcSrcFile(pCVar5,(osfildef *)__stream,pCVar6);
        iVar2 = 1;
        local_160 = open_source(char_const*,CResLoader*,char_const*,int*,int*)::names;
LAB_00209baa:
        iVar3 = ucs_str_starts_with(buf + 2,sVar4 - 2,"#charset ",iVar2,0);
        uVar11 = 2;
        if (iVar3 != 0) {
          lVar7 = 0;
          for (lVar9 = -0x14; 1 < sVar4 + lVar9; lVar9 = lVar9 + -2) {
            pcVar10 = buf + lVar7 + 0x14;
            iVar3 = ucs_char_eq(pcVar10,' ',iVar2,0);
            if ((iVar3 == 0) && (iVar3 = ucs_char_eq(pcVar10,'\t',iVar2,0), iVar3 == 0)) {
              iVar3 = ucs_char_eq(pcVar10,'\"',iVar2,0);
              if (iVar3 != 0) {
                uVar11 = (sVar4 - lVar7) - 0x16;
                goto LAB_00209d74;
              }
              break;
            }
            lVar7 = lVar7 + 2;
          }
LAB_00209c57:
          uVar11 = 2;
        }
LAB_00209c5a:
        fseek(__stream,uVar11 + __off,0);
        return pCVar5;
      }
      if (pCVar5 != (CTcSrcFile *)0x0) {
        local_160 = open_source::names;
        iVar2 = 0;
        goto LAB_00209baa;
      }
      if ((8 < sVar4) && (iVar2 = bcmp(buf,"#charset ",9), iVar2 == 0)) {
        for (lVar9 = 0; sVar4 - 9 != lVar9; lVar9 = lVar9 + 1) {
          cVar1 = buf[lVar9 + 9];
          if ((cVar1 != '\t') && (cVar1 != ' ')) {
            if (cVar1 == '\"') {
              lVar7 = lVar9 + 10;
              goto LAB_00209e84;
            }
            break;
          }
        }
      }
    }
LAB_00209c91:
    fseek(__stream,__off,0);
    if (default_charset == (char *)0x0) {
      pCVar6 = (CCharmapToUni *)operator_new(0x210);
      memset(pCVar6,0,0x210);
      (pCVar6->super_CCharmap).ref_cnt_ = 1;
      (pCVar6->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_003040d8;
    }
    else {
      pCVar6 = CCharmapToUni::load(res_loader,default_charset);
      if (pCVar6 == (CCharmapToUni *)0x0) {
        *default_charset_error = 1;
        fclose(__stream);
        goto LAB_00209ccb;
      }
    }
    pCVar5 = (CTcSrcFile *)operator_new(0x430);
    CTcSrcFile(pCVar5,(osfildef *)__stream,pCVar6);
  }
  return pCVar5;
LAB_00209e84:
  if (((sVar4 - 10 == lVar9) || (cVar1 = buf[lVar9 + 10], cVar1 == '\n')) || (cVar1 == '\r'))
  goto LAB_00209c91;
  if (cVar1 == '\"') {
    fseek(__stream,__off + lVar9 + 0xb,0);
    buf[lVar9 + 10] = '\0';
    pCVar6 = CCharmapToUni::load(res_loader,buf + lVar7);
    if (pCVar6 != (CCharmapToUni *)0x0) {
      pCVar5 = (CTcSrcFile *)operator_new(0x430);
      CTcSrcFile(pCVar5,(osfildef *)__stream,pCVar6);
      return pCVar5;
    }
    *charset_error = 1;
    goto LAB_00209c91;
  }
  lVar9 = lVar9 + 1;
  goto LAB_00209e84;
LAB_00209d74:
  pcVar10 = *local_160;
  if (pcVar10 == (char *)0x0) goto LAB_00209c57;
  iVar3 = ucs_str_starts_with(buf + lVar7 + 0x16,uVar11,pcVar10,iVar2,1);
  if (((iVar3 != 0) && (sVar4 = strlen(pcVar10), sVar4 * 2 + 2 <= uVar11)) &&
     (iVar3 = ucs_char_eq(buf + sVar4 * 2 + lVar7 + 0x16,'\"',iVar2,0), iVar3 != 0)) {
    uVar11 = (ulong)((int)lVar7 + (int)sVar4 * 2 + 0x18);
    goto LAB_00209c5a;
  }
  local_160 = local_160 + 1;
  goto LAB_00209d74;
}

Assistant:

CTcSrcFile *CTcSrcFile::open_source(const char *filename,
                                    class CResLoader *res_loader,
                                    const char *default_charset,
                                    int *charset_error,
                                    int *default_charset_error)
{
    char buf[275];
    size_t siz;
    osfildef *fp;
    long startofs;
    CCharmapToUni *mapper;

    /* presume we won't find an invalid #charset directive */
    *charset_error = FALSE;

    /* presume we'll have no problem with the default character set */
    *default_charset_error = FALSE;

    /* 
     *   open the file in binary mode, so that we can scan the first few
     *   bytes to see if we can detect the character set from information
     *   at the beginning of the file 
     */
    fp = osfoprb(filename, OSFTTEXT);

    /* if we couldn't open the file, return failure */
    if (fp == 0)
        return 0;

    /* note the starting offset in the file */
    startofs = osfpos(fp);

    /* read the first few bytes of the file */
    siz = osfrbc(fp, buf, sizeof(buf));

    /* check for a 3-byte UTF-8 byte-order marker */
    if (siz >= 3  && (uchar)buf[0] == 0xEF && (uchar)buf[1] == 0xBB
        && (uchar)buf[2] == 0xBF)
    {
        char *p;
        size_t rem;
        uint skip;

        /* skip at least the three-byte marker sequence */
        skip = 3;
        
        /* 
         *   check for a #charset marker for utf-8 - this would be redundant,
         *   but we'll allow it 
         */
        p = buf + 3;
        rem = siz - 3;
        if (rem > 9 && memcmp(p, "#charset ", 9) == 0)
        {
            /* skip spaces */
            for (p += 9, rem -= 9 ; rem != 0 && (*p == ' ' || *p == '\t') ;
                 ++p, --rem);

            /* check for valid character set markers */
            if (rem >= 7 && memicmp(p, "\"utf-8\"", 7) == 0)
            {
                /* skip the whole sequence */
                skip = (p + 7) - buf;
            }
            else if (rem >= 6 && memicmp(p, "\"utf8\"", 6) == 0)
            {
                /* skip the whole sequence */
                skip = (p + 6) - buf;
            }
        }

        /* seek past the character set markers */
        osfseek(fp, startofs + skip, OSFSK_SET);

        /* return a new utf-8 decoder */
        return new CTcSrcFile(fp, new CCharmapToUniUTF8());
    }

    /* if we read at least two bytes, try auto-detecting unicode */
    if (siz >= 2)
    {
        CTcSrcFile *srcf;
        const char *const *cs_names;
        int bige;

        /* presume we won't find a byte-order marker */
        srcf = 0;
        
        /* if the first bytes are 0xFF 0xFE, it's UCS-2 low-byte first */
        if ((unsigned char)buf[0] == 0xFF && (unsigned char)buf[1] == 0xFE)
        {
            static const char *names[] = { "unicodel", "utf-16le", 0 };

            /* create a UCS-2 little-endian reader */
            srcf = new CTcSrcFile(fp, new CCharmapToUniUcs2Little());
            bige = FALSE;
            cs_names = names;
        }

        /* if the first bytes are 0xFE 0xFF, it's UCS-2 high-byte first */
        if ((unsigned char)buf[0] == 0xFE && (unsigned char)buf[1] == 0xFF)
        {
            static const char *names[] = { "unicodeb", "utf-16be", 0 };

            /* create a UCS-2 little-endian reader */
            srcf = new CTcSrcFile(fp, new CCharmapToUniUcs2Big());
            bige = TRUE;
            cs_names = names;
        }

        /* if we found the byte-order marker, we know the character set */
        if (srcf != 0)
        {
            uint skip;

            /* we at least want to skip the byte-order marker */
            skip = 2;
            
            /* check to see if we have a '#charset' directive */
            if (ucs_str_starts_with(buf + 2, siz - 2, "#charset ",
                                    bige, FALSE))
            {
                char *p;
                size_t rem;
                
                /* scan past following spaces */
                for (p = buf + 2 + 18, rem = siz - 2 - 18 ;
                     rem >= 2 && (ucs_char_eq(p, ' ', bige, FALSE)
                                  || ucs_char_eq(p, '\t', bige, FALSE)) ;
                     p += 2, rem -= 2) ;

                /* check for a '"' */
                if (rem >= 2 && ucs_char_eq(p, '"', bige, FALSE))
                {
                    const char *const *n;

                    /* skip the '"' */
                    p += 2;
                    rem -= 2;
                    
                    /* 
                     *   check for a match to any of the valid names for this
                     *   character set 
                     */
                    for (n = cs_names ; *n != 0 ; ++n)
                    {
                        /* if it's a match, stop scanning */
                        if (ucs_str_starts_with(p, rem, *n, bige, TRUE))
                        {
                            size_t l;

                            /* get the length of the name */
                            l = strlen(*n) * 2;

                            /* check for a close quote */
                            if (rem >= l + 2
                                && ucs_char_eq(p + l, '"', bige, FALSE))
                            {
                                /* skip the name and the quote */
                                p += l + 2;
                                rem -= l + 2;

                                /* skip the source text to this point */
                                skip = p - buf;

                                /* stop scanning */
                                break;
                            }
                        }
                    }
                }
            }

            /* seek just past the character set indicators */
            osfseek(fp, startofs + skip, OSFSK_SET);

            /* return the file */
            return srcf;
        }
    }

    /*
     *   It doesn't appear to use UCS-2 encoding (at least, the file
     *   doesn't start with a byte-order sensing sequence).  Check to see
     *   if the file starts with "#charset " in ASCII single-byte
     *   characters.  
     */
    if (siz >= 9 && memcmp(buf, "#charset ", 9) == 0)
    {
        char *p;
        size_t rem;
        
        /* skip the #charset string and any following spaces */
        for (p = buf + 9, rem = siz - 9 ;
             rem > 0 && (*p == ' ' || *p == '\t') ; ++p, --rem) ;

        /* make sure we're looking at a '"' */
        if (rem != 0 && *p == '"')
        {
            char *charset_name;

            /* skip the open quote */
            ++p;
            --rem;
            
            /* remember where the character set name starts */
            charset_name = p;

            /* 
             *   find the closing quote, which must occur before a CR or
             *   LF character 
             */
            for ( ; rem > 0 && *p != '"' && *p != 10 && *p != 13 ;
                 ++p, --rem) ;

            /* make sure we found a matching quote */
            if (rem != 0 && *p == '"')
            {
                /* seek just past the #charset string */
                osfseek(fp, startofs + (p - buf) + 1, OSFSK_SET);

                /* 
                 *   put a null terminator at the end of the character set
                 *   name 
                 */
                *p = '\0';

                /* create a mapper */
                mapper = CCharmapToUni::load(res_loader, charset_name);

                /* 
                 *   if that succeeded, return a reader for the mapper;
                 *   otherwise, simply proceed as though no #charset had
                 *   been present, so that we create a default mapper 
                 */
                if (mapper != 0)
                {
                    /* success - return a reader */
                    return new CTcSrcFile(fp, mapper);
                }
                else
                {
                    /* tell the caller the #charset was invalid */
                    *charset_error = TRUE;
                }
            }
        }
    }

    /* 
     *   we didn't find any sensing codes, so seek back to the start of
     *   the file 
     */
    osfseek(fp, startofs, OSFSK_SET);

    /*
     *   We couldn't identify the file's character set based on anything
     *   in the file, so create a mapper for the given default character
     *   set.  If there's not even a default character set defined, create
     *   a plain ASCII mapper.  
     */
    if (default_charset != 0)
        mapper = CCharmapToUni::load(res_loader, default_charset);
    else
        mapper = new CCharmapToUniASCII();

    /* check to see if we created a mapper */
    if (mapper != 0)
    {
        /* return a source file reader based on the mapper */
        return new CTcSrcFile(fp, mapper);
    }
    else
    {
        /* 
         *   we failed to create a mapper for the default character set -
         *   flag the problem 
         */
        *default_charset_error = TRUE;

        /* close the input file */
        osfcls(fp);

        /* return failure */
        return 0;
    }
}